

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

void __thiscall
ImageTypeManager::setConvertFunction(ImageTypeManager *this,CopyForm1 Copy,Image *in,Image *out)

{
  uint8_t uVar1;
  uint8_t uVar2;
  undefined8 uVar3;
  mapped_type *pp_Var4;
  long lVar5;
  ImageTemplate<unsigned_char> *this_00;
  mapped_type *image;
  ImageTemplate<unsigned_char> *in_RCX;
  ImageTemplate<unsigned_char> *in_RDX;
  mapped_type in_RSI;
  long in_RDI;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff18;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff48;
  undefined2 uVar6;
  imageException *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  map<unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
  *in_stack_ffffffffffffff60;
  uint8_t local_30;
  uint8_t local_2f;
  pair<unsigned_char,_unsigned_char> local_2e [7];
  ImageTemplate<unsigned_char> *local_20;
  ImageTemplate<unsigned_char> *local_18;
  mapped_type local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDX);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::type(local_20);
  if (uVar1 == uVar2) {
    uVar3 = __cxa_allocate_exception(0x28);
    imageException::imageException(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    __cxa_throw(uVar3,&imageException::typeinfo,imageException::~imageException);
  }
  local_2f = PenguinV_Image::ImageTemplate<unsigned_char>::type(local_18);
  local_30 = PenguinV_Image::ImageTemplate<unsigned_char>::type(local_20);
  std::pair<unsigned_char,_unsigned_char>::pair<unsigned_char,_unsigned_char,_true>
            (local_2e,&local_2f,&local_30);
  pp_Var4 = std::
            map<std::pair<unsigned_char,_unsigned_char>,_void_(*)(const_PenguinV_Image::ImageTemplate<unsigned_char>_&,_PenguinV_Image::ImageTemplate<unsigned_char>_&),_std::less<std::pair<unsigned_char,_unsigned_char>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_char>,_void_(*)(const_PenguinV_Image::ImageTemplate<unsigned_char>_&,_PenguinV_Image::ImageTemplate<unsigned_char>_&)>_>_>
            ::operator[]((map<std::pair<unsigned_char,_unsigned_char>,_void_(*)(const_PenguinV_Image::ImageTemplate<unsigned_char>_&,_PenguinV_Image::ImageTemplate<unsigned_char>_&),_std::less<std::pair<unsigned_char,_unsigned_char>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_char>,_void_(*)(const_PenguinV_Image::ImageTemplate<unsigned_char>_&,_PenguinV_Image::ImageTemplate<unsigned_char>_&)>_>_>
                          *)in_stack_ffffffffffffff60,
                         (key_type *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  *pp_Var4 = local_10;
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            ((ImageTemplate<unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
             (uint32_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff50,(uint8_t)((ulong)local_10 >> 0x38),
             (uint8_t)((ulong)local_10 >> 0x30));
  uVar6 = (undefined2)((ulong)local_10 >> 0x30);
  lVar5 = in_RDI + 0x60;
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::type(local_18);
  std::
  map<unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
  ::operator[](in_stack_ffffffffffffff60,(key_type *)CONCAT17(uVar1,in_stack_ffffffffffffff58));
  PenguinV_Image::ImageTemplate<unsigned_char>::operator=
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x122804);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            ((ImageTemplate<unsigned_char> *)CONCAT17(uVar1,in_stack_ffffffffffffff58),
             (uint32_t)((ulong)lVar5 >> 0x20),(uint32_t)lVar5,(uint8_t)((ushort)uVar6 >> 8),
             (uint8_t)uVar6);
  this_00 = (ImageTemplate<unsigned_char> *)(in_RDI + 0x60);
  PenguinV_Image::ImageTemplate<unsigned_char>::type(local_20);
  image = std::
          map<unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
          ::operator[](in_stack_ffffffffffffff60,
                       (key_type *)CONCAT17(uVar1,in_stack_ffffffffffffff58));
  PenguinV_Image::ImageTemplate<unsigned_char>::operator=(this_00,image);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x12287b);
  return;
}

Assistant:

void ImageTypeManager::setConvertFunction( Image_Function_Helper::FunctionTable::CopyForm1 Copy, const PenguinV_Image::Image & in, const PenguinV_Image::Image & out )
{
    if ( in.type() == out.type() )
        throw imageException( "Cannot register same type images for intertype copy" );

    _intertypeConvertMap[std::pair<uint8_t, uint8_t>( in.type(), out.type() )] = Copy;

    _image[in.type()] = in.generate();
    _image[out.type()] = out.generate();
}